

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::append<char_const*,void>
          (SmallVectorImpl<unsigned_char> *this,char *in_start,char *in_end)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (long)in_end - (long)in_start;
  uVar4 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
      super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity - uVar4 <
      uVar5) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,uVar4 + uVar5,1);
    uVar4 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                   super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  }
  if (0 < (long)uVar5) {
    pvVar1 = (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    uVar2 = uVar5 + 1;
    lVar3 = 0;
    do {
      *(char *)((long)pvVar1 + lVar3 + uVar4) = in_start[lVar3];
      uVar2 = uVar2 - 1;
      lVar3 = lVar3 + 1;
    } while (1 < uVar2);
    uVar4 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                   super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  }
  if (uVar5 + uVar4 <=
      (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
             super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size =
         (uint)(uVar5 + uVar4);
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }